

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O0

bool spvParseVulkanEnv(uint32_t vulkan_ver,uint32_t spirv_ver,spv_target_env_conflict *env)

{
  undefined4 uVar1;
  undefined4 uVar2;
  spv_target_env_conflict local_44;
  uint uStack_40;
  VulkanEnv triple;
  VulkanEnv *__end1;
  VulkanEnv *__begin1;
  VulkanEnv (*__range1) [6];
  spv_target_env_conflict *env_local;
  uint32_t spirv_ver_local;
  uint32_t vulkan_ver_local;
  
  __end1 = ordered_vulkan_envs;
  while( true ) {
    if (__end1 == (VulkanEnv *)"SPIR-V 1.0") {
      return false;
    }
    uVar1 = __end1->vulkan_env;
    uVar2 = __end1->vulkan_ver;
    if ((vulkan_ver <= (uint)uVar2) && (spirv_ver <= __end1->spirv_ver)) break;
    __end1 = __end1 + 1;
  }
  *env = uVar1;
  return true;
}

Assistant:

bool spvParseVulkanEnv(uint32_t vulkan_ver, uint32_t spirv_ver,
                       spv_target_env* env) {
  for (auto triple : ordered_vulkan_envs) {
    if (triple.vulkan_ver >= vulkan_ver && triple.spirv_ver >= spirv_ver) {
      *env = triple.vulkan_env;
      return true;
    }
  }
  return false;
}